

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_tlm.cpp
# Opt level: O0

void __thiscall
CmdTlm::blobs(CmdTlm *this,vector<Commands::Blob,_std::allocator<Commands::Blob>_> *blobs)

{
  vector<Commands::Blob,_std::allocator<Commands::Blob>_> *this_00;
  bool bVar1;
  Writer *pWVar2;
  size_type sVar3;
  reference data;
  Blob *blob;
  iterator __end1;
  iterator __begin1;
  vector<Commands::Blob,_std::allocator<Commands::Blob>_> *__range1;
  vector<Commands::Blob,_std::allocator<Commands::Blob>_> *local_18;
  vector<Commands::Blob,_std::allocator<Commands::Blob>_> *blobs_local;
  CmdTlm *this_local;
  
  __range1._7_1_ = 4;
  local_18 = blobs;
  blobs_local = (vector<Commands::Blob,_std::allocator<Commands::Blob>_> *)this;
  pWVar2 = Writer::operator<<((Writer *)
                              ((long)&this->packetWriter->field_0x0 +
                              *(long *)((long)*this->packetWriter + -0x20)),
                              (uchar *)((long)&__range1 + 7));
  sVar3 = std::vector<Commands::Blob,_std::allocator<Commands::Blob>_>::size(local_18);
  __range1._4_2_ = (undefined2)sVar3;
  Writer::operator<<(pWVar2,(unsigned_short *)((long)&__range1 + 4));
  this_00 = local_18;
  __end1 = std::vector<Commands::Blob,_std::allocator<Commands::Blob>_>::begin(local_18);
  blob = (Blob *)std::vector<Commands::Blob,_std::allocator<Commands::Blob>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Commands::Blob_*,_std::vector<Commands::Blob,_std::allocator<Commands::Blob>_>_>
                                *)&blob);
    if (!bVar1) break;
    data = __gnu_cxx::
           __normal_iterator<Commands::Blob_*,_std::vector<Commands::Blob,_std::allocator<Commands::Blob>_>_>
           ::operator*(&__end1);
    pWVar2 = Writer::operator<<((Writer *)
                                ((long)&this->packetWriter->field_0x0 +
                                *(long *)((long)*this->packetWriter + -0x20)),&data->x);
    pWVar2 = Writer::operator<<(pWVar2,&data->y);
    Writer::operator<<(pWVar2,&data->size);
    __gnu_cxx::
    __normal_iterator<Commands::Blob_*,_std::vector<Commands::Blob,_std::allocator<Commands::Blob>_>_>
    ::operator++(&__end1);
  }
  (**(code **)((long)*this->packetWriter + 8))();
  return;
}

Assistant:

void  CmdTlm::blobs(vector<Blob> & blobs) {
  *packetWriter << (uint8_t) 4 << (uint16_t) blobs.size();
  for (Blob &blob : blobs) {
    *packetWriter << blob.x << blob.y << blob.size;
  }
  packetWriter->write_packet();
}